

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

DetachedBuffer * __thiscall
flatbuffers::vector_downward<unsigned_int>::release(vector_downward<unsigned_int> *this)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint8_t *puVar5;
  DetachedBuffer *pDVar6;
  undefined1 in_DIL;
  DetachedBuffer *fb;
  undefined7 in_register_00000039;
  
  pDVar6 = (DetachedBuffer *)CONCAT71(in_register_00000039,in_DIL);
  bVar1 = this->own_allocator_;
  puVar3 = this->buf_;
  sVar4 = this->reserved_;
  puVar5 = this->cur_;
  uVar2 = this->size_;
  pDVar6->allocator_ = this->allocator_;
  pDVar6->own_allocator_ = bVar1;
  pDVar6->buf_ = puVar3;
  pDVar6->reserved_ = sVar4;
  pDVar6->cur_ = puVar5;
  pDVar6->size_ = (ulong)uVar2;
  if (bVar1 == true) {
    this->allocator_ = (Allocator *)0x0;
    this->own_allocator_ = false;
  }
  this->reserved_ = 0;
  this->size_ = 0;
  this->scratch_ = (uint8_t *)0x0;
  this->buf_ = (uint8_t *)0x0;
  this->cur_ = (uint8_t *)0x0;
  return pDVar6;
}

Assistant:

DetachedBuffer release() {
    // allocator ownership (if any) is transferred to DetachedBuffer.
    DetachedBuffer fb(allocator_, own_allocator_, buf_, reserved_, cur_,
                      size());
    if (own_allocator_) {
      allocator_ = nullptr;
      own_allocator_ = false;
    }
    buf_ = nullptr;
    clear();
    return fb;
  }